

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTileDescriptionAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::TileDescription>::readValueFrom
          (TypedAttribute<Imf_2_5::TileDescription> *this,IStream *is,int size,int version)

{
  uint *in_RDI;
  uchar levelRoundingMode;
  uchar levelMode;
  uchar tmp;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  undefined1 in_stack_ffffffffffffffe6;
  byte bVar1;
  byte in_stack_ffffffffffffffe7;
  
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            ((IStream *)
             CONCAT17(in_stack_ffffffffffffffe7,
                      CONCAT16(in_stack_ffffffffffffffe6,
                               CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
             in_RDI);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            ((IStream *)
             CONCAT17(in_stack_ffffffffffffffe7,
                      CONCAT16(in_stack_ffffffffffffffe6,
                               CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
             in_RDI);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            ((IStream *)
             CONCAT17(in_stack_ffffffffffffffe7,
                      CONCAT16(in_stack_ffffffffffffffe6,
                               CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
             (uchar *)in_RDI);
  bVar1 = in_stack_ffffffffffffffe7 & 0xf;
  if (3 < bVar1) {
    bVar1 = 3;
  }
  in_RDI[4] = (uint)bVar1;
  bVar1 = (byte)((int)(uint)in_stack_ffffffffffffffe7 >> 4);
  if (2 < bVar1) {
    bVar1 = 2;
  }
  in_RDI[5] = (uint)bVar1;
  return;
}

Assistant:

void
TileDescriptionAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is,
					 int size,
					 int version)
{
    Xdr::read <StreamIO> (is, _value.xSize);
    Xdr::read <StreamIO> (is, _value.ySize);

    unsigned char tmp;
    Xdr::read <StreamIO> (is, tmp);

    //
    // four bits are allocated for 'mode' for future use (16 possible values)
    // but only values 0,1,2 are currently valid. '3' is a special valid enum value
    // that indicates bad values have been used
    //
    // roundingMode can only be 0 or 1, and 2 is a special enum value for 'bad enum'
    //
    unsigned char levelMode = tmp & 0x0f;
    if(levelMode > 3)
    {
        levelMode = 3;
    }

    _value.mode = LevelMode(levelMode);

    unsigned char levelRoundingMode = (tmp >> 4) & 0x0f;
    if(levelRoundingMode > 2)
    {
        levelRoundingMode = 2;
    }

    _value.roundingMode = LevelRoundingMode (levelRoundingMode);
    
}